

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hebrwcal.cpp
# Opt level: O0

void __thiscall
icu_63::HebrewCalendar::roll
          (HebrewCalendar *this,UCalendarDateFields field,int32_t amount,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  int local_34;
  int32_t newMonth;
  int32_t yearLength;
  UBool leapYear;
  int32_t year;
  int32_t month;
  UErrorCode *status_local;
  int32_t amount_local;
  UCalendarDateFields field_local;
  HebrewCalendar *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (field == UCAL_MONTH) {
      iVar2 = Calendar::get(&this->super_Calendar,UCAL_MONTH,status);
      iVar3 = Calendar::get(&this->super_Calendar,UCAL_YEAR,status);
      UVar1 = isLeapYear(iVar3);
      iVar3 = monthsInYear(iVar3);
      local_34 = iVar2 + amount % iVar3;
      if (UVar1 == '\0') {
        if (((amount < 1) || (4 < iVar2)) || (local_34 < 5)) {
          if (((amount < 0) && (5 < iVar2)) && (local_34 < 6)) {
            local_34 = local_34 + -1;
          }
        }
        else {
          local_34 = local_34 + 1;
        }
      }
      Calendar::set(&this->super_Calendar,UCAL_MONTH,(local_34 + 0xd) % 0xd);
      (*(this->super_Calendar).super_UObject._vptr_UObject[0x2c])(this,5,status);
    }
    else {
      Calendar::roll(&this->super_Calendar,field,amount,status);
    }
  }
  return;
}

Assistant:

void HebrewCalendar::roll(UCalendarDateFields field, int32_t amount, UErrorCode& status)
{
    if(U_FAILURE(status)) {
        return;
    }
    switch (field) {
  case UCAL_MONTH:
      {
          int32_t month = get(UCAL_MONTH, status);
          int32_t year = get(UCAL_YEAR, status);

          UBool leapYear = isLeapYear(year);
          int32_t yearLength = monthsInYear(year);
          int32_t newMonth = month + (amount % yearLength);
          //
          // If it's not a leap year and we're rolling past the missing month
          // of ADAR_1, we need to roll an extra month to make up for it.
          //
          if (!leapYear) {
              if (amount > 0 && month < ADAR_1 && newMonth >= ADAR_1) {
                  newMonth++;
              } else if (amount < 0 && month > ADAR_1 && newMonth <= ADAR_1) {
                  newMonth--;
              }
          }
          set(UCAL_MONTH, (newMonth + 13) % 13);
          pinField(UCAL_DAY_OF_MONTH, status);
          return;
      }
  default:
      Calendar::roll(field, amount, status);
    }
}